

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RealSchur.h
# Opt level: O2

Index __thiscall
Eigen::RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>::findSmallSubdiagEntry
          (RealSchur<Eigen::Matrix<double,_2,_2,_0,_2,_2>_> *this,Index iu)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  ulong uVar4;
  double *pdVar5;
  Index res;
  ulong uVar6;
  
  pdVar5 = (this->m_matT).super_PlainObjectBase<Eigen::Matrix<double,_2,_2,_0,_2,_2>_>.m_storage.
           m_data.array + iu * 3;
  uVar4 = iu;
  do {
    uVar6 = uVar4;
    if ((long)uVar6 < 1) {
      return iu >> 0x3f & iu;
    }
    pdVar1 = pdVar5 + -3;
    pdVar2 = pdVar5 + -2;
    dVar3 = *pdVar5;
    pdVar5 = pdVar5 + -3;
    uVar4 = uVar6 - 1;
  } while ((ABS(dVar3) + ABS(*pdVar1)) * 2.220446049250313e-16 < ABS(*pdVar2));
  return uVar6;
}

Assistant:

inline typename MatrixType::Index RealSchur<MatrixType>::findSmallSubdiagEntry(Index iu)
{
  using std::abs;
  Index res = iu;
  while (res > 0)
  {
    Scalar s = abs(m_matT.coeff(res-1,res-1)) + abs(m_matT.coeff(res,res));
    if (abs(m_matT.coeff(res,res-1)) <= NumTraits<Scalar>::epsilon() * s)
      break;
    res--;
  }
  return res;
}